

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wizard.c
# Opt level: O2

int mon_has_special(monst *mtmp)

{
  boolean bVar1;
  obj *otmp;
  
  otmp = (obj *)&mtmp->minvent;
  while( true ) {
    otmp = otmp->nobj;
    if (otmp == (obj *)0x0) {
      return 0;
    }
    if (otmp->otyp == 0xd9) {
      return 1;
    }
    bVar1 = is_quest_artifact(otmp);
    if (bVar1 != '\0') {
      return 1;
    }
    if ((ushort)otmp->otyp - 0x10b < 2) break;
    if (otmp->otyp == 0x1bd) {
      return 1;
    }
  }
  return 1;
}

Assistant:

int mon_has_special(struct monst *mtmp)
{
	struct obj *otmp;

	for (otmp = mtmp->minvent; otmp; otmp = otmp->nobj)
		if (otmp->otyp == AMULET_OF_YENDOR ||
			is_quest_artifact(otmp) ||
			otmp->otyp == BELL_OF_OPENING ||
			otmp->otyp == CANDELABRUM_OF_INVOCATION ||
			otmp->otyp == SPE_BOOK_OF_THE_DEAD) return 1;
	return 0;
}